

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderSubroutineTests.cpp
# Opt level: O1

bool __thiscall
gl4cts::ShaderSubroutine::FunctionalTest12::testSSBODraw
          (FunctionalTest12 *this,GLuint subroutine_index,GLuint *expected_results)

{
  ostringstream *this_00;
  undefined1 auVar1 [16];
  int iVar2;
  deUint32 dVar3;
  undefined4 extraout_var;
  char *pcVar5;
  bool bVar6;
  undefined1 auVar7 [16];
  GLuint local_1b4;
  undefined1 local_1b0 [120];
  ios_base local_138 [264];
  long lVar4;
  
  local_1b4 = subroutine_index;
  iVar2 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar4 = CONCAT44(extraout_var,iVar2);
  (**(code **)(lVar4 + 0x1668))(0x8b30,1,&local_1b4);
  dVar3 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar3,"UniformSubroutinesuiv",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                  ,0x1972);
  (**(code **)(lVar4 + 0x538))(0,0,1);
  dVar3 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar3,"DrawArrays",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                  ,0x1976);
  pcVar5 = (char *)(**(code **)(lVar4 + 0xcf8))(0x90d2,35000);
  dVar3 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar3,"MapBuffer",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                  ,0x197a);
  auVar1 = *(undefined1 (*) [16])expected_results;
  auVar7[0] = -(*pcVar5 == auVar1[0]);
  auVar7[1] = -(pcVar5[1] == auVar1[1]);
  auVar7[2] = -(pcVar5[2] == auVar1[2]);
  auVar7[3] = -(pcVar5[3] == auVar1[3]);
  auVar7[4] = -(pcVar5[4] == auVar1[4]);
  auVar7[5] = -(pcVar5[5] == auVar1[5]);
  auVar7[6] = -(pcVar5[6] == auVar1[6]);
  auVar7[7] = -(pcVar5[7] == auVar1[7]);
  auVar7[8] = -(pcVar5[8] == auVar1[8]);
  auVar7[9] = -(pcVar5[9] == auVar1[9]);
  auVar7[10] = -(pcVar5[10] == auVar1[10]);
  auVar7[0xb] = -(pcVar5[0xb] == auVar1[0xb]);
  auVar7[0xc] = -(pcVar5[0xc] == auVar1[0xc]);
  auVar7[0xd] = -(pcVar5[0xd] == auVar1[0xd]);
  auVar7[0xe] = -(pcVar5[0xe] == auVar1[0xe]);
  auVar7[0xf] = -(pcVar5[0xf] == auVar1[0xf]);
  bVar6 = (ushort)((ushort)(SUB161(auVar7 >> 7,0) & 1) | (ushort)(SUB161(auVar7 >> 0xf,0) & 1) << 1
                   | (ushort)(SUB161(auVar7 >> 0x17,0) & 1) << 2 |
                   (ushort)(SUB161(auVar7 >> 0x1f,0) & 1) << 3 |
                   (ushort)(SUB161(auVar7 >> 0x27,0) & 1) << 4 |
                   (ushort)(SUB161(auVar7 >> 0x2f,0) & 1) << 5 |
                   (ushort)(SUB161(auVar7 >> 0x37,0) & 1) << 6 |
                   (ushort)(SUB161(auVar7 >> 0x3f,0) & 1) << 7 |
                   (ushort)(SUB161(auVar7 >> 0x47,0) & 1) << 8 |
                   (ushort)(SUB161(auVar7 >> 0x4f,0) & 1) << 9 |
                   (ushort)(SUB161(auVar7 >> 0x57,0) & 1) << 10 |
                   (ushort)(SUB161(auVar7 >> 0x5f,0) & 1) << 0xb |
                   (ushort)(SUB161(auVar7 >> 0x67,0) & 1) << 0xc |
                   (ushort)(SUB161(auVar7 >> 0x6f,0) & 1) << 0xd |
                   (ushort)(SUB161(auVar7 >> 0x77,0) & 1) << 0xe | (ushort)(auVar7[0xf] >> 7) << 0xf
                  ) == 0xffff;
  if (!bVar6) {
    local_1b0._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
    this_00 = (ostringstream *)(local_1b0 + 8);
    std::__cxx11::ostringstream::ostringstream(this_00);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this_00,"Error. Invalid result. ",0x17);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"Result: [ ",10);
    std::ostream::_M_insert<unsigned_long>((ulong)this_00);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
    std::ostream::_M_insert<unsigned_long>((ulong)this_00);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
    std::ostream::_M_insert<unsigned_long>((ulong)this_00);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
    std::ostream::_M_insert<unsigned_long>((ulong)this_00);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00," ] ",3);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"Expected: [ ",0xc);
    std::ostream::_M_insert<unsigned_long>((ulong)this_00);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
    std::ostream::_M_insert<unsigned_long>((ulong)this_00);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
    std::ostream::_M_insert<unsigned_long>((ulong)this_00);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
    std::ostream::_M_insert<unsigned_long>((ulong)this_00);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00," ]",2);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(this_00);
    std::ios_base::~ios_base(local_138);
  }
  (**(code **)(lVar4 + 0x1670))(0x90d2);
  dVar3 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar3,"UnmapBuffer",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                  ,0x198b);
  return bVar6;
}

Assistant:

bool FunctionalTest12::testSSBODraw(GLuint subroutine_index, const GLuint expected_results[4]) const
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Set subroutine uniforms */
	gl.uniformSubroutinesuiv(GL_FRAGMENT_SHADER, 1, &subroutine_index);
	GLU_EXPECT_NO_ERROR(gl.getError(), "UniformSubroutinesuiv");

	/* Draw */
	gl.drawArrays(GL_POINTS, 0 /* first */, 1 /* count */);
	GLU_EXPECT_NO_ERROR(gl.getError(), "DrawArrays");

	/* Capture results */
	GLuint* ssbo_results = (GLuint*)gl.mapBuffer(GL_SHADER_STORAGE_BUFFER, GL_READ_ONLY);
	GLU_EXPECT_NO_ERROR(gl.getError(), "MapBuffer");

	/* Verify */
	bool result = (0 == memcmp(expected_results, ssbo_results, 4 * sizeof(GLuint)));

	if (false == result)
	{
		m_context.getTestContext().getLog() << tcu::TestLog::Message << "Error. Invalid result. "
											<< "Result: [ " << ssbo_results[0] << ", " << ssbo_results[1] << ", "
											<< ssbo_results[2] << ", " << ssbo_results[3] << " ] "
											<< "Expected: [ " << expected_results[0] << ", " << expected_results[1]
											<< ", " << expected_results[2] << ", " << expected_results[3] << " ]"
											<< tcu::TestLog::EndMessage;
	}

	/* Unmap buffer */
	gl.unmapBuffer(GL_SHADER_STORAGE_BUFFER);
	GLU_EXPECT_NO_ERROR(gl.getError(), "UnmapBuffer");

	/* Done */
	return result;
}